

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinylogger.h
# Opt level: O3

shared_ptr<tlog::ConsoleOutput> * tlog::ConsoleOutput::global(void)

{
  int iVar1;
  ConsoleOutput *this;
  
  if (global()::consoleOutput == '\0') {
    iVar1 = __cxa_guard_acquire(&global()::consoleOutput);
    if (iVar1 != 0) {
      this = (ConsoleOutput *)operator_new(0x10);
      ConsoleOutput(this);
      global::consoleOutput.super___shared_ptr<tlog::ConsoleOutput,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = this;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<tlog::ConsoleOutput*>
                (&global::consoleOutput.
                  super___shared_ptr<tlog::ConsoleOutput,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 this);
      __cxa_atexit(std::__shared_ptr<tlog::ConsoleOutput,_(__gnu_cxx::_Lock_policy)2>::~__shared_ptr
                   ,&global::consoleOutput,&__dso_handle);
      __cxa_guard_release(&global()::consoleOutput);
    }
  }
  return &global::consoleOutput;
}

Assistant:

static std::shared_ptr<ConsoleOutput>& global() {
            static auto consoleOutput = std::shared_ptr<ConsoleOutput>(new ConsoleOutput());
            return consoleOutput;
        }